

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError pm_end_sysex(PmInternal *midi)

{
  PmError PVar1;
  
  PVar1 = (*midi->dictionary->end_sysex)(midi,0);
  midi->sysex_in_progress = 0;
  if (PVar1 == pmHostError) {
    (*midi->dictionary->host_error)(midi,pm_hosterror_text,0x100);
    pm_hosterror = 1;
  }
  return PVar1;
}

Assistant:

static PmError pm_end_sysex(PmInternal *midi)
{
    PmError err = (*midi->dictionary->end_sysex)(midi, 0);
    midi->sysex_in_progress = FALSE;
    if (err == pmHostError) {
        midi->dictionary->host_error(midi, pm_hosterror_text, 
                                     PM_HOST_ERROR_MSG_LEN);
        pm_hosterror = TRUE;
    }
    return err;
}